

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellReissner4::ShapeFunctionsDerivativeX
          (ChElementShellReissner4 *this,ShapeVector *Nx,double x,double y)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = 1.0 - y;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = y + 1.0;
  auVar2 = vunpcklpd_avx(auVar3,auVar2);
  auVar1 = vpermpd_avx2(ZEXT1632(auVar2),0x50);
  (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>).m_storage.m_data.array[0] =
       auVar1._0_8_ * 0.25;
  (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>).m_storage.m_data.array[1] =
       auVar1._8_8_ * -0.25;
  (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>).m_storage.m_data.array[2] =
       auVar1._16_8_ * -0.25;
  (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>).m_storage.m_data.array[3] =
       auVar1._24_8_ * 0.25;
  return;
}

Assistant:

void ChElementShellReissner4::ShapeFunctionsDerivativeX(ShapeVector& Nx, double x, double y) {
    double xi[2];
    xi[0] = x, xi[1] = y;
    Nx(0) = L1_1(xi);
    Nx(1) = L2_1(xi);
    Nx(2) = L3_1(xi);
    Nx(3) = L4_1(xi);
}